

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O3

size_t HUF_compress1X_usingCTable_internal
                 (void *dst,size_t dstSize,void *src,size_t srcSize,HUF_CElt *CTable,int flags)

{
  bool bVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  ulong *puVar5;
  int iVar6;
  byte *pbVar7;
  long lVar8;
  long lVar9;
  ulong *puVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  ulong *puVar20;
  HUF_CElt endMark;
  HUF_CElt local_38;
  
  if ((7 < dstSize) && (dstSize != 8)) {
    uVar3 = (uint)*CTable;
    puVar20 = (ulong *)((long)dst + (dstSize - 8));
    uVar4 = (uint)srcSize;
    puVar5 = (ulong *)dst;
    if (uVar3 < 0xc && ((*CTable & 0xffffffff) * srcSize >> 3) + 8 <= dstSize) {
      switch(uVar3) {
      case 7:
        uVar3 = uVar4 + 7;
        if (-1 < (int)uVar4) {
          uVar3 = uVar4;
        }
        iVar6 = uVar4 - (uVar3 & 0xfffffff8);
        if (iVar6 < 1) {
          uVar12 = 0;
          uVar17 = 0;
        }
        else {
          pbVar7 = (byte *)((long)(int)uVar4 + (long)src);
          iVar6 = iVar6 + 1;
          uVar17 = 0;
          uVar12 = 0;
          do {
            pbVar7 = pbVar7 + -1;
            uVar11 = CTable[(ulong)*pbVar7 + 1];
            if (0xc < (uVar11 & 0xff)) goto LAB_007c418a;
            uVar12 = uVar12 + uVar11;
            uVar18 = uVar12 & 0xff;
            if (0x40 < uVar18) goto LAB_007c416b;
            uVar17 = uVar11 & 0xffffffffffffff00 | uVar17 >> ((byte)uVar11 & 0x3f);
            srcSize = (size_t)((int)srcSize - 1);
            iVar6 = iVar6 + -1;
          } while (1 < iVar6);
          if (uVar18 == 0) goto LAB_007c41a9;
          if (puVar20 < dst) goto LAB_007c41c8;
          *(ulong *)dst = uVar17 >> (-(char)uVar12 & 0x3fU);
          puVar5 = (ulong *)((uVar18 >> 3) + (long)dst);
          if (puVar20 < puVar5) goto LAB_007c41e7;
          uVar12 = (ulong)((uint)uVar12 & 7);
        }
        if ((srcSize & 7) != 0) {
LAB_007c4244:
          __assert_fail("n % kUnroll == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                        ,0x3cc,
                        "void HUF_compress1X_usingCTable_internal_body_loop(HUF_CStream_t *, const BYTE *, size_t, const HUF_CElt *, int, int, int)"
                       );
        }
        if ((srcSize & 8) != 0) {
          lVar2 = (long)(int)srcSize;
          lVar8 = 7;
          do {
            uVar11 = CTable[(ulong)*(byte *)((long)src + lVar8 + lVar2 + -8) + 1];
            if (0xc < (uVar11 & 0xff)) goto LAB_007c418a;
            uVar12 = uVar12 + uVar11;
            if (0x40 < ((uint)uVar12 & 0xff)) goto LAB_007c416b;
            uVar17 = uVar17 >> ((byte)uVar11 & 0x3f) | uVar11;
            lVar8 = lVar8 + -1;
          } while (lVar8 != 0);
          uVar11 = CTable[(ulong)*(byte *)((long)src + lVar2 + -8) + 1];
          if (0xc < (uVar11 & 0xff)) goto LAB_007c418a;
          uVar12 = uVar12 + uVar11;
          uVar18 = uVar12 & 0xff;
          if (0x40 < uVar18) goto LAB_007c416b;
          uVar17 = uVar17 >> ((byte)uVar11 & 0x3f) | uVar11 & 0xffffffffffffff00;
          if (uVar18 == 0) goto LAB_007c41a9;
          if (puVar20 < puVar5) {
LAB_007c41c8:
            __assert_fail("bitC->ptr <= bitC->endPtr",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                          ,0x393,"void HUF_flushBits(HUF_CStream_t *, int)");
          }
          *puVar5 = uVar17 >> (-(char)uVar12 & 0x3fU);
          puVar5 = (ulong *)((uVar18 >> 3) + (long)puVar5);
          if (puVar20 < puVar5) {
LAB_007c41e7:
            __assert_fail("!kFast || bitC->ptr <= bitC->endPtr",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                          ,0x396,"void HUF_flushBits(HUF_CStream_t *, int)");
          }
          srcSize = lVar2 - 8;
          uVar12 = (ulong)((uint)uVar12 & 7);
        }
        if ((srcSize & 0xf) != 0) goto LAB_007c4263;
        if (0 < (int)srcSize) {
          uVar11 = srcSize & 0xffffffff;
          lVar2 = (long)src + (uVar11 - 1);
          lVar8 = (long)src + (uVar11 - 9);
          do {
            lVar9 = 7;
            do {
              uVar18 = CTable[(ulong)*(byte *)(lVar2 + -7 + lVar9) + 1];
              if (0xc < (uVar18 & 0xff)) goto LAB_007c418a;
              uVar12 = uVar12 + uVar18;
              if (0x40 < ((uint)uVar12 & 0xff)) goto LAB_007c416b;
              uVar17 = uVar17 >> ((byte)uVar18 & 0x3f) | uVar18;
              lVar9 = lVar9 + -1;
            } while (lVar9 != 0);
            uVar18 = CTable[(ulong)*(byte *)((uVar11 - 8) + (long)src) + 1];
            if (0xc < (uVar18 & 0xff)) goto LAB_007c418a;
            uVar12 = uVar12 + uVar18;
            uVar13 = uVar12 & 0xff;
            if (0x40 < uVar13) goto LAB_007c416b;
            uVar17 = uVar17 >> ((byte)uVar18 & 0x3f) | uVar18 & 0xffffffffffffff00;
            if (uVar13 == 0) goto LAB_007c41a9;
            if (puVar20 < puVar5) goto LAB_007c41c8;
            *puVar5 = uVar17 >> (-(char)uVar12 & 0x3fU);
            puVar5 = (ulong *)((uVar13 >> 3) + (long)puVar5);
            if (puVar20 < puVar5) goto LAB_007c41e7;
            lVar19 = 7;
            lVar9 = 0;
            uVar18 = 0;
            do {
              uVar13 = CTable[(ulong)*(byte *)(lVar8 + -7 + lVar19) + 1];
              if (0xc < (uVar13 & 0xff)) goto LAB_007c418a;
              lVar9 = lVar9 + uVar13;
              if (0x40 < ((uint)lVar9 & 0xff)) goto LAB_007c416b;
              uVar18 = uVar18 >> ((byte)uVar13 & 0x3f) | uVar13;
              lVar19 = lVar19 + -1;
            } while (lVar19 != 0);
            uVar13 = CTable[(ulong)*(byte *)((long)src + (uVar11 - 0x10)) + 1];
            if (0xc < (uVar13 & 0xff)) goto LAB_007c418a;
            uVar14 = lVar9 + uVar13;
            if (0x40 < (uVar14 & 0xff)) goto LAB_007c416b;
            if ((int)(uVar14 & 0xff) == 0x40) goto LAB_007c4225;
            uVar16 = uVar14 + ((uint)uVar12 & 7);
            uVar12 = uVar16 & 0xff;
            if (0x40 < uVar12) goto LAB_007c4206;
            if (uVar12 == 0) goto LAB_007c41a9;
            uVar17 = uVar18 >> ((byte)uVar13 & 0x3f) | uVar13 & 0xffffffffffffff00 |
                     uVar17 >> ((byte)uVar14 & 0x3f);
            *puVar5 = uVar17 >> (-(char)uVar16 & 0x3fU);
            puVar5 = (ulong *)((uVar12 >> 3) + (long)puVar5);
            if (puVar20 < puVar5) goto LAB_007c41e7;
            uVar12 = (ulong)((uint)uVar16 & 7);
            srcSize = uVar11 - 0x10;
            lVar2 = lVar2 + -0x10;
            lVar8 = lVar8 + -0x10;
            bVar1 = 0x10 < (long)uVar11;
            uVar11 = srcSize;
          } while (bVar1);
        }
        break;
      case 8:
        if ((int)uVar4 % 7 < 1) {
          uVar12 = 0;
          uVar17 = 0;
        }
        else {
          pbVar7 = (byte *)((long)(int)uVar4 + (long)src);
          iVar6 = (int)uVar4 % 7 + 1;
          uVar17 = 0;
          uVar12 = 0;
          do {
            pbVar7 = pbVar7 + -1;
            uVar11 = CTable[(ulong)*pbVar7 + 1];
            if (0xc < (uVar11 & 0xff)) goto LAB_007c418a;
            uVar12 = uVar12 + uVar11;
            uVar18 = uVar12 & 0xff;
            if (0x40 < uVar18) goto LAB_007c416b;
            uVar17 = uVar11 & 0xffffffffffffff00 | uVar17 >> ((byte)uVar11 & 0x3f);
            srcSize = (size_t)((int)srcSize - 1);
            iVar6 = iVar6 + -1;
          } while (1 < iVar6);
          if (uVar18 == 0) goto LAB_007c41a9;
          if (puVar20 < dst) goto LAB_007c41c8;
          *(ulong *)dst = uVar17 >> (-(char)uVar12 & 0x3fU);
          puVar5 = (ulong *)((uVar18 >> 3) + (long)dst);
          if (puVar20 < puVar5) goto LAB_007c41e7;
          uVar12 = (ulong)((uint)uVar12 & 7);
        }
        uVar4 = (int)srcSize * -0x49249249 + 0x12492492;
        if (0x24924924 < uVar4) goto LAB_007c4244;
        if (0x12492492 < (uVar4 >> 1 | (uint)((uVar4 & 1) != 0) << 0x1f)) {
          lVar2 = (long)(int)srcSize;
          lVar8 = 6;
          do {
            uVar11 = CTable[(ulong)*(byte *)((long)src + lVar8 + lVar2 + -7) + 1];
            if (0xc < (uVar11 & 0xff)) goto LAB_007c418a;
            uVar12 = uVar12 + uVar11;
            if (0x40 < ((uint)uVar12 & 0xff)) goto LAB_007c416b;
            uVar17 = uVar17 >> ((byte)uVar11 & 0x3f) | uVar11;
            lVar8 = lVar8 + -1;
          } while (lVar8 != 0);
          uVar11 = CTable[(ulong)*(byte *)((long)src + lVar2 + -7) + 1];
          if (0xc < (uVar11 & 0xff)) goto LAB_007c418a;
          uVar12 = uVar12 + uVar11;
          uVar18 = uVar12 & 0xff;
          if (0x40 < uVar18) goto LAB_007c416b;
          uVar17 = uVar17 >> ((byte)uVar11 & 0x3f) | uVar11 & 0xffffffffffffff00;
          if (uVar18 == 0) goto LAB_007c41a9;
          if (puVar20 < puVar5) goto LAB_007c41c8;
          *puVar5 = uVar17 >> (-(char)uVar12 & 0x3fU);
          puVar5 = (ulong *)((uVar18 >> 3) + (long)puVar5);
          if (puVar20 < puVar5) goto LAB_007c41e7;
          srcSize = lVar2 - 7;
          uVar12 = (ulong)((uint)uVar12 & 7);
        }
        uVar4 = (int)srcSize * -0x49249249 + 0x12492492;
        if (0x12492492 < (uVar4 >> 1 | (uint)((uVar4 & 1) != 0) << 0x1f)) goto LAB_007c4263;
        if (0 < (int)srcSize) {
          uVar11 = srcSize & 0xffffffff;
          lVar2 = (long)src + (uVar11 - 1);
          lVar8 = (long)src + (uVar11 - 8);
          do {
            lVar9 = 6;
            do {
              uVar18 = CTable[(ulong)*(byte *)(lVar2 + -6 + lVar9) + 1];
              if (0xc < (uVar18 & 0xff)) goto LAB_007c418a;
              uVar12 = uVar12 + uVar18;
              if (0x40 < ((uint)uVar12 & 0xff)) goto LAB_007c416b;
              uVar17 = uVar17 >> ((byte)uVar18 & 0x3f) | uVar18;
              lVar9 = lVar9 + -1;
            } while (lVar9 != 0);
            uVar18 = CTable[(ulong)*(byte *)((uVar11 - 7) + (long)src) + 1];
            if (0xc < (uVar18 & 0xff)) goto LAB_007c418a;
            uVar12 = uVar12 + uVar18;
            uVar13 = uVar12 & 0xff;
            if (0x40 < uVar13) goto LAB_007c416b;
            uVar17 = uVar17 >> ((byte)uVar18 & 0x3f) | uVar18 & 0xffffffffffffff00;
            if (uVar13 == 0) goto LAB_007c41a9;
            if (puVar20 < puVar5) goto LAB_007c41c8;
            *puVar5 = uVar17 >> (-(char)uVar12 & 0x3fU);
            puVar5 = (ulong *)((uVar13 >> 3) + (long)puVar5);
            if (puVar20 < puVar5) goto LAB_007c41e7;
            lVar19 = 6;
            lVar9 = 0;
            uVar18 = 0;
            do {
              uVar13 = CTable[(ulong)*(byte *)(lVar8 + -6 + lVar19) + 1];
              if (0xc < (uVar13 & 0xff)) goto LAB_007c418a;
              lVar9 = lVar9 + uVar13;
              if (0x40 < ((uint)lVar9 & 0xff)) goto LAB_007c416b;
              uVar18 = uVar18 >> ((byte)uVar13 & 0x3f) | uVar13;
              lVar19 = lVar19 + -1;
            } while (lVar19 != 0);
            uVar13 = CTable[(ulong)*(byte *)((long)src + (uVar11 - 0xe)) + 1];
            if (0xc < (uVar13 & 0xff)) goto LAB_007c418a;
            uVar14 = lVar9 + uVar13;
            if (0x40 < (uVar14 & 0xff)) goto LAB_007c416b;
            if ((int)(uVar14 & 0xff) == 0x40) goto LAB_007c4225;
            uVar16 = uVar14 + ((uint)uVar12 & 7);
            uVar12 = uVar16 & 0xff;
            if (0x40 < uVar12) goto LAB_007c4206;
            if (uVar12 == 0) goto LAB_007c41a9;
            uVar17 = uVar18 >> ((byte)uVar13 & 0x3f) | uVar13 & 0xffffffffffffff00 |
                     uVar17 >> ((byte)uVar14 & 0x3f);
            *puVar5 = uVar17 >> (-(char)uVar16 & 0x3fU);
            puVar5 = (ulong *)((uVar12 >> 3) + (long)puVar5);
            if (puVar20 < puVar5) goto LAB_007c41e7;
            uVar12 = (ulong)((uint)uVar16 & 7);
            srcSize = uVar11 - 0xe;
            lVar2 = lVar2 + -0xe;
            lVar8 = lVar8 + -0xe;
            bVar1 = 0xe < (long)uVar11;
            uVar11 = srcSize;
          } while (bVar1);
        }
        break;
      case 9:
        if ((int)uVar4 % 6 < 1) {
          uVar12 = 0;
          uVar17 = 0;
        }
        else {
          pbVar7 = (byte *)((long)(int)uVar4 + (long)src);
          iVar6 = (int)uVar4 % 6 + 1;
          uVar17 = 0;
          uVar12 = 0;
          do {
            pbVar7 = pbVar7 + -1;
            uVar11 = CTable[(ulong)*pbVar7 + 1];
            if (0xc < (uVar11 & 0xff)) goto LAB_007c418a;
            uVar12 = uVar12 + uVar11;
            uVar18 = uVar12 & 0xff;
            if (0x40 < uVar18) goto LAB_007c416b;
            uVar17 = uVar11 & 0xffffffffffffff00 | uVar17 >> ((byte)uVar11 & 0x3f);
            srcSize = (size_t)((int)srcSize - 1);
            iVar6 = iVar6 + -1;
          } while (1 < iVar6);
          if (uVar18 == 0) goto LAB_007c41a9;
          if (puVar20 < dst) goto LAB_007c41c8;
          *(ulong *)dst = uVar17 >> (-(char)uVar12 & 0x3fU);
          puVar5 = (ulong *)((uVar18 >> 3) + (long)dst);
          if (puVar20 < puVar5) goto LAB_007c41e7;
          uVar12 = (ulong)((uint)uVar12 & 7);
        }
        iVar6 = (int)srcSize;
        uVar4 = iVar6 * -0x55555555 + 0x2aaaaaaa;
        if (0x2aaaaaaa < (uVar4 >> 1 | (uint)((uVar4 & 1) != 0) << 0x1f)) goto LAB_007c4244;
        if (0x15555554 < (iVar6 * -0x55555555 + 0x2aaaaaa8U >> 2 | iVar6 * -0x40000000)) {
          lVar2 = (long)iVar6;
          lVar8 = 5;
          do {
            uVar11 = CTable[(ulong)*(byte *)((long)src + lVar8 + lVar2 + -6) + 1];
            if (0xc < (uVar11 & 0xff)) goto LAB_007c418a;
            uVar12 = uVar12 + uVar11;
            if (0x40 < ((uint)uVar12 & 0xff)) goto LAB_007c416b;
            uVar17 = uVar17 >> ((byte)uVar11 & 0x3f) | uVar11;
            lVar8 = lVar8 + -1;
          } while (lVar8 != 0);
          uVar11 = CTable[(ulong)*(byte *)((long)src + lVar2 + -6) + 1];
          if (0xc < (uVar11 & 0xff)) goto LAB_007c418a;
          uVar12 = uVar12 + uVar11;
          uVar18 = uVar12 & 0xff;
          if (0x40 < uVar18) goto LAB_007c416b;
          uVar17 = uVar17 >> ((byte)uVar11 & 0x3f) | uVar11 & 0xffffffffffffff00;
          if (uVar18 == 0) goto LAB_007c41a9;
          if (puVar20 < puVar5) goto LAB_007c41c8;
          *puVar5 = uVar17 >> (-(char)uVar12 & 0x3fU);
          puVar5 = (ulong *)((uVar18 >> 3) + (long)puVar5);
          if (puVar20 < puVar5) goto LAB_007c41e7;
          srcSize = lVar2 - 6;
          uVar12 = (ulong)((uint)uVar12 & 7);
        }
        iVar6 = (int)srcSize;
        if (0x15555554 < (iVar6 * -0x55555555 + 0x2aaaaaa8U >> 2 | iVar6 * -0x40000000))
        goto LAB_007c4263;
        if (0 < iVar6) {
          uVar11 = srcSize & 0xffffffff;
          lVar2 = (long)src + (uVar11 - 1);
          lVar8 = (long)src + (uVar11 - 7);
          do {
            lVar9 = 5;
            do {
              uVar18 = CTable[(ulong)*(byte *)(lVar2 + -5 + lVar9) + 1];
              if (0xc < (uVar18 & 0xff)) goto LAB_007c418a;
              uVar12 = uVar12 + uVar18;
              if (0x40 < ((uint)uVar12 & 0xff)) goto LAB_007c416b;
              uVar17 = uVar17 >> ((byte)uVar18 & 0x3f) | uVar18;
              lVar9 = lVar9 + -1;
            } while (lVar9 != 0);
            uVar18 = CTable[(ulong)*(byte *)((uVar11 - 6) + (long)src) + 1];
            if (0xc < (uVar18 & 0xff)) goto LAB_007c418a;
            uVar12 = uVar12 + uVar18;
            uVar13 = uVar12 & 0xff;
            if (0x40 < uVar13) goto LAB_007c416b;
            uVar17 = uVar17 >> ((byte)uVar18 & 0x3f) | uVar18 & 0xffffffffffffff00;
            if (uVar13 == 0) goto LAB_007c41a9;
            if (puVar20 < puVar5) goto LAB_007c41c8;
            *puVar5 = uVar17 >> (-(char)uVar12 & 0x3fU);
            puVar5 = (ulong *)((uVar13 >> 3) + (long)puVar5);
            if (puVar20 < puVar5) goto LAB_007c41e7;
            lVar19 = 5;
            lVar9 = 0;
            uVar18 = 0;
            do {
              uVar13 = CTable[(ulong)*(byte *)(lVar8 + -5 + lVar19) + 1];
              if (0xc < (uVar13 & 0xff)) goto LAB_007c418a;
              lVar9 = lVar9 + uVar13;
              if (0x40 < ((uint)lVar9 & 0xff)) goto LAB_007c416b;
              uVar18 = uVar18 >> ((byte)uVar13 & 0x3f) | uVar13;
              lVar19 = lVar19 + -1;
            } while (lVar19 != 0);
            uVar13 = CTable[(ulong)*(byte *)((long)src + (uVar11 - 0xc)) + 1];
            if (0xc < (uVar13 & 0xff)) goto LAB_007c418a;
            uVar14 = lVar9 + uVar13;
            if (0x40 < (uVar14 & 0xff)) goto LAB_007c416b;
            if ((int)(uVar14 & 0xff) == 0x40) goto LAB_007c4225;
            uVar16 = uVar14 + ((uint)uVar12 & 7);
            uVar12 = uVar16 & 0xff;
            if (0x40 < uVar12) goto LAB_007c4206;
            if (uVar12 == 0) goto LAB_007c41a9;
            uVar17 = uVar18 >> ((byte)uVar13 & 0x3f) | uVar13 & 0xffffffffffffff00 |
                     uVar17 >> ((byte)uVar14 & 0x3f);
            *puVar5 = uVar17 >> (-(char)uVar16 & 0x3fU);
            puVar5 = (ulong *)((uVar12 >> 3) + (long)puVar5);
            if (puVar20 < puVar5) goto LAB_007c41e7;
            uVar12 = (ulong)((uint)uVar16 & 7);
            srcSize = uVar11 - 0xc;
            lVar2 = lVar2 + -0xc;
            lVar8 = lVar8 + -0xc;
            bVar1 = 0xc < (long)uVar11;
            uVar11 = srcSize;
          } while (bVar1);
        }
        break;
      case 10:
        if ((int)uVar4 % 5 < 1) {
          uVar12 = 0;
          uVar17 = 0;
        }
        else {
          pbVar7 = (byte *)((long)(int)uVar4 + (long)src);
          iVar6 = (int)uVar4 % 5 + 1;
          uVar17 = 0;
          uVar12 = 0;
          do {
            pbVar7 = pbVar7 + -1;
            uVar11 = CTable[(ulong)*pbVar7 + 1];
            if (0xc < (uVar11 & 0xff)) goto LAB_007c418a;
            uVar12 = uVar12 + uVar11;
            uVar18 = uVar12 & 0xff;
            if (0x40 < uVar18) goto LAB_007c416b;
            uVar17 = uVar11 & 0xffffffffffffff00 | uVar17 >> ((byte)uVar11 & 0x3f);
            srcSize = (size_t)((int)srcSize - 1);
            iVar6 = iVar6 + -1;
          } while (1 < iVar6);
          if (uVar18 == 0) goto LAB_007c41a9;
          if (puVar20 < dst) goto LAB_007c41c8;
          *(ulong *)dst = uVar17 >> (-(char)uVar12 & 0x3fU);
          puVar5 = (ulong *)((uVar18 >> 3) + (long)dst);
          if (puVar20 < puVar5) goto LAB_007c41e7;
          uVar12 = (ulong)((uint)uVar12 & 7);
        }
        iVar6 = (int)srcSize * -0x33333333;
        if (0x33333332 < iVar6 + 0x19999999U) goto LAB_007c4244;
        uVar4 = iVar6 + 0x19999998;
        if (0x19999998 < (uVar4 >> 1 | (uint)((uVar4 & 1) != 0) << 0x1f)) {
          lVar2 = (long)(int)srcSize;
          lVar8 = 4;
          do {
            uVar11 = CTable[(ulong)*(byte *)((long)src + lVar8 + lVar2 + -5) + 1];
            if (0xc < (uVar11 & 0xff)) goto LAB_007c418a;
            uVar12 = uVar12 + uVar11;
            if (0x40 < ((uint)uVar12 & 0xff)) goto LAB_007c416b;
            uVar17 = uVar17 >> ((byte)uVar11 & 0x3f) | uVar11;
            lVar8 = lVar8 + -1;
          } while (lVar8 != 0);
          uVar11 = CTable[(ulong)*(byte *)((long)src + lVar2 + -5) + 1];
          if (0xc < (uVar11 & 0xff)) goto LAB_007c418a;
          uVar12 = uVar12 + uVar11;
          uVar18 = uVar12 & 0xff;
          if (0x40 < uVar18) goto LAB_007c416b;
          uVar17 = uVar17 >> ((byte)uVar11 & 0x3f) | uVar11;
          if (uVar18 == 0) goto LAB_007c41a9;
          if (puVar20 < puVar5) goto LAB_007c41c8;
          *puVar5 = uVar17 >> (-(char)uVar12 & 0x3fU);
          puVar5 = (ulong *)((uVar18 >> 3) + (long)puVar5);
          if (puVar20 < puVar5) goto LAB_007c41e7;
          srcSize = lVar2 - 5;
          uVar12 = (ulong)((uint)uVar12 & 7);
        }
        uVar4 = (int)srcSize * -0x33333333 + 0x19999998;
        if (0x19999998 < (uVar4 >> 1 | (uint)((uVar4 & 1) != 0) << 0x1f)) goto LAB_007c4263;
        if (0 < (int)srcSize) {
          uVar11 = srcSize & 0xffffffff;
          lVar2 = (long)src + (uVar11 - 1);
          lVar8 = (long)src + (uVar11 - 6);
          do {
            lVar9 = 4;
            do {
              uVar18 = CTable[(ulong)*(byte *)(lVar2 + -4 + lVar9) + 1];
              if (0xc < (uVar18 & 0xff)) goto LAB_007c418a;
              uVar12 = uVar12 + uVar18;
              if (0x40 < ((uint)uVar12 & 0xff)) goto LAB_007c416b;
              uVar17 = uVar17 >> ((byte)uVar18 & 0x3f) | uVar18;
              lVar9 = lVar9 + -1;
            } while (lVar9 != 0);
            uVar18 = CTable[(ulong)*(byte *)((uVar11 - 5) + (long)src) + 1];
            if (0xc < (uVar18 & 0xff)) goto LAB_007c418a;
            uVar12 = uVar12 + uVar18;
            uVar13 = uVar12 & 0xff;
            if (0x40 < uVar13) goto LAB_007c416b;
            uVar18 = uVar17 >> ((byte)uVar18 & 0x3f) | uVar18;
            if (uVar13 == 0) goto LAB_007c41a9;
            if (puVar20 < puVar5) goto LAB_007c41c8;
            *puVar5 = uVar18 >> (-(char)uVar12 & 0x3fU);
            puVar5 = (ulong *)((uVar13 >> 3) + (long)puVar5);
            if (puVar20 < puVar5) goto LAB_007c41e7;
            lVar19 = 4;
            lVar9 = 0;
            uVar17 = 0;
            do {
              uVar13 = CTable[(ulong)*(byte *)(lVar8 + -4 + lVar19) + 1];
              if (0xc < (uVar13 & 0xff)) goto LAB_007c418a;
              lVar9 = lVar9 + uVar13;
              if (0x40 < ((uint)lVar9 & 0xff)) goto LAB_007c416b;
              uVar17 = uVar17 >> ((byte)uVar13 & 0x3f) | uVar13;
              lVar19 = lVar19 + -1;
            } while (lVar19 != 0);
            uVar13 = CTable[(ulong)*(byte *)((long)src + (uVar11 - 10)) + 1];
            if (0xc < (uVar13 & 0xff)) goto LAB_007c418a;
            uVar14 = lVar9 + uVar13;
            if (0x40 < (uVar14 & 0xff)) goto LAB_007c416b;
            if ((int)(uVar14 & 0xff) == 0x40) goto LAB_007c4225;
            uVar16 = uVar14 + ((uint)uVar12 & 7);
            uVar12 = uVar16 & 0xff;
            if (0x40 < uVar12) goto LAB_007c4206;
            if (uVar12 == 0) goto LAB_007c41a9;
            uVar17 = uVar17 >> ((byte)uVar13 & 0x3f) | uVar18 >> ((byte)uVar14 & 0x3f) | uVar13;
            *puVar5 = uVar17 >> (-(char)uVar16 & 0x3fU);
            puVar5 = (ulong *)((uVar12 >> 3) + (long)puVar5);
            if (puVar20 < puVar5) goto LAB_007c41e7;
            uVar12 = (ulong)((uint)uVar16 & 7);
            srcSize = uVar11 - 10;
            lVar2 = lVar2 + -10;
            lVar8 = lVar8 + -10;
            bVar1 = 10 < (long)uVar11;
            uVar11 = srcSize;
          } while (bVar1);
        }
        break;
      case 0xb:
        if ((int)uVar4 % 5 < 1) {
          uVar12 = 0;
          uVar17 = 0;
        }
        else {
          pbVar7 = (byte *)((long)(int)uVar4 + (long)src);
          iVar6 = (int)uVar4 % 5 + 1;
          uVar17 = 0;
          uVar12 = 0;
          do {
            pbVar7 = pbVar7 + -1;
            uVar11 = CTable[(ulong)*pbVar7 + 1];
            if (0xc < (uVar11 & 0xff)) goto LAB_007c418a;
            uVar12 = uVar12 + uVar11;
            uVar18 = uVar12 & 0xff;
            if (0x40 < uVar18) goto LAB_007c416b;
            uVar17 = uVar11 & 0xffffffffffffff00 | uVar17 >> ((byte)uVar11 & 0x3f);
            srcSize = (size_t)((int)srcSize - 1);
            iVar6 = iVar6 + -1;
          } while (1 < iVar6);
          if (uVar18 == 0) goto LAB_007c41a9;
          if (puVar20 < dst) goto LAB_007c41c8;
          *(ulong *)dst = uVar17 >> (-(char)uVar12 & 0x3fU);
          puVar5 = (ulong *)((uVar18 >> 3) + (long)dst);
          if (puVar20 < puVar5) goto LAB_007c41e7;
          uVar12 = (ulong)((uint)uVar12 & 7);
        }
        iVar6 = (int)srcSize * -0x33333333;
        if (0x33333332 < iVar6 + 0x19999999U) goto LAB_007c4244;
        uVar4 = iVar6 + 0x19999998;
        if (0x19999998 < (uVar4 >> 1 | (uint)((uVar4 & 1) != 0) << 0x1f)) {
          lVar2 = (long)(int)srcSize;
          lVar8 = 4;
          do {
            uVar11 = CTable[(ulong)*(byte *)((long)src + lVar8 + lVar2 + -5) + 1];
            if (0xc < (uVar11 & 0xff)) goto LAB_007c418a;
            uVar12 = uVar12 + uVar11;
            if (0x40 < ((uint)uVar12 & 0xff)) goto LAB_007c416b;
            uVar17 = uVar17 >> ((byte)uVar11 & 0x3f) | uVar11;
            lVar8 = lVar8 + -1;
          } while (lVar8 != 0);
          uVar11 = CTable[(ulong)*(byte *)((long)src + lVar2 + -5) + 1];
          if (0xc < (uVar11 & 0xff)) goto LAB_007c418a;
          uVar12 = uVar12 + uVar11;
          uVar18 = uVar12 & 0xff;
          if (0x40 < uVar18) goto LAB_007c416b;
          uVar17 = uVar17 >> ((byte)uVar11 & 0x3f) | uVar11 & 0xffffffffffffff00;
          if (uVar18 == 0) goto LAB_007c41a9;
          if (puVar20 < puVar5) goto LAB_007c41c8;
          *puVar5 = uVar17 >> (-(char)uVar12 & 0x3fU);
          puVar5 = (ulong *)((uVar18 >> 3) + (long)puVar5);
          if (puVar20 < puVar5) goto LAB_007c41e7;
          srcSize = lVar2 - 5;
          uVar12 = (ulong)((uint)uVar12 & 7);
        }
        uVar4 = (int)srcSize * -0x33333333 + 0x19999998;
        if (0x19999998 < (uVar4 >> 1 | (uint)((uVar4 & 1) != 0) << 0x1f)) goto LAB_007c4263;
        if (0 < (int)srcSize) {
          uVar11 = srcSize & 0xffffffff;
          lVar2 = (long)src + (uVar11 - 1);
          lVar8 = (long)src + (uVar11 - 6);
          do {
            lVar9 = 4;
            do {
              uVar18 = CTable[(ulong)*(byte *)(lVar2 + -4 + lVar9) + 1];
              if (0xc < (uVar18 & 0xff)) goto LAB_007c418a;
              uVar12 = uVar12 + uVar18;
              if (0x40 < ((uint)uVar12 & 0xff)) goto LAB_007c416b;
              uVar17 = uVar17 >> ((byte)uVar18 & 0x3f) | uVar18;
              lVar9 = lVar9 + -1;
            } while (lVar9 != 0);
            uVar18 = CTable[(ulong)*(byte *)((uVar11 - 5) + (long)src) + 1];
            if (0xc < (uVar18 & 0xff)) goto LAB_007c418a;
            uVar12 = uVar12 + uVar18;
            uVar13 = uVar12 & 0xff;
            if (0x40 < uVar13) goto LAB_007c416b;
            uVar17 = uVar17 >> ((byte)uVar18 & 0x3f) | uVar18 & 0xffffffffffffff00;
            if (uVar13 == 0) goto LAB_007c41a9;
            if (puVar20 < puVar5) goto LAB_007c41c8;
            *puVar5 = uVar17 >> (-(char)uVar12 & 0x3fU);
            puVar5 = (ulong *)((uVar13 >> 3) + (long)puVar5);
            if (puVar20 < puVar5) goto LAB_007c41e7;
            lVar19 = 4;
            lVar9 = 0;
            uVar18 = 0;
            do {
              uVar13 = CTable[(ulong)*(byte *)(lVar8 + -4 + lVar19) + 1];
              if (0xc < (uVar13 & 0xff)) goto LAB_007c418a;
              lVar9 = lVar9 + uVar13;
              if (0x40 < ((uint)lVar9 & 0xff)) goto LAB_007c416b;
              uVar18 = uVar18 >> ((byte)uVar13 & 0x3f) | uVar13;
              lVar19 = lVar19 + -1;
            } while (lVar19 != 0);
            uVar13 = CTable[(ulong)*(byte *)((long)src + (uVar11 - 10)) + 1];
            if (0xc < (uVar13 & 0xff)) goto LAB_007c418a;
            uVar14 = lVar9 + uVar13;
            if (0x40 < (uVar14 & 0xff)) goto LAB_007c416b;
            if ((int)(uVar14 & 0xff) == 0x40) goto LAB_007c4225;
            uVar16 = uVar14 + ((uint)uVar12 & 7);
            uVar12 = uVar16 & 0xff;
            if (0x40 < uVar12) goto LAB_007c4206;
            if (uVar12 == 0) goto LAB_007c41a9;
            uVar17 = uVar18 >> ((byte)uVar13 & 0x3f) | uVar13 & 0xffffffffffffff00 |
                     uVar17 >> ((byte)uVar14 & 0x3f);
            *puVar5 = uVar17 >> (-(char)uVar16 & 0x3fU);
            puVar5 = (ulong *)((uVar12 >> 3) + (long)puVar5);
            if (puVar20 < puVar5) goto LAB_007c41e7;
            uVar12 = (ulong)((uint)uVar16 & 7);
            srcSize = uVar11 - 10;
            lVar2 = lVar2 + -10;
            lVar8 = lVar8 + -10;
            bVar1 = 10 < (long)uVar11;
            uVar11 = srcSize;
          } while (bVar1);
        }
        break;
      default:
        if ((int)uVar4 % 9 < 1) {
          uVar12 = 0;
          uVar17 = 0;
        }
        else {
          pbVar7 = (byte *)((long)(int)uVar4 + (long)src);
          iVar6 = (int)uVar4 % 9 + 1;
          uVar17 = 0;
          uVar12 = 0;
          do {
            pbVar7 = pbVar7 + -1;
            uVar11 = CTable[(ulong)*pbVar7 + 1];
            if (0xc < (uVar11 & 0xff)) goto LAB_007c418a;
            uVar12 = uVar12 + uVar11;
            uVar18 = uVar12 & 0xff;
            if (0x40 < uVar18) goto LAB_007c416b;
            uVar17 = uVar11 & 0xffffffffffffff00 | uVar17 >> ((byte)uVar11 & 0x3f);
            srcSize = (size_t)((int)srcSize - 1);
            iVar6 = iVar6 + -1;
          } while (1 < iVar6);
          if (uVar18 == 0) goto LAB_007c41a9;
          if (puVar20 < dst) goto LAB_007c41c8;
          *(ulong *)dst = uVar17 >> (-(char)uVar12 & 0x3fU);
          puVar5 = (ulong *)((uVar18 >> 3) + (long)dst);
          if (puVar20 < puVar5) goto LAB_007c41e7;
          uVar12 = (ulong)((uint)uVar12 & 7);
        }
        uVar4 = (int)srcSize * 0x38e38e39 + 0xe38e38e;
        if (0x1c71c71c < uVar4) goto LAB_007c4244;
        if (0xe38e38e < (uVar4 >> 1 | (uint)((uVar4 & 1) != 0) << 0x1f)) {
          lVar2 = (long)(int)srcSize;
          lVar8 = 8;
          do {
            uVar11 = CTable[(ulong)*(byte *)((long)src + lVar8 + lVar2 + -9) + 1];
            if (0xc < (uVar11 & 0xff)) goto LAB_007c418a;
            uVar12 = uVar12 + uVar11;
            if (0x40 < ((uint)uVar12 & 0xff)) goto LAB_007c416b;
            uVar17 = uVar17 >> ((byte)uVar11 & 0x3f) | uVar11;
            lVar8 = lVar8 + -1;
          } while (lVar8 != 0);
          uVar11 = CTable[(ulong)*(byte *)((long)src + lVar2 + -9) + 1];
          if (0xc < (uVar11 & 0xff)) goto LAB_007c418a;
          uVar12 = uVar12 + uVar11;
          uVar18 = uVar12 & 0xff;
          if (0x40 < uVar18) goto LAB_007c416b;
          uVar17 = uVar17 >> ((byte)uVar11 & 0x3f) | uVar11;
          if (uVar18 == 0) goto LAB_007c41a9;
          if (puVar20 < puVar5) goto LAB_007c41c8;
          *puVar5 = uVar17 >> (-(char)uVar12 & 0x3fU);
          puVar5 = (ulong *)((uVar18 >> 3) + (long)puVar5);
          if (puVar20 < puVar5) goto LAB_007c41e7;
          srcSize = lVar2 - 9;
          uVar12 = (ulong)((uint)uVar12 & 7);
        }
        uVar4 = (int)srcSize * 0x38e38e39 + 0xe38e38e;
        if (0xe38e38e < (uVar4 >> 1 | (uint)((uVar4 & 1) != 0) << 0x1f)) goto LAB_007c4263;
        if (0 < (int)srcSize) {
          uVar11 = srcSize & 0xffffffff;
          lVar2 = (long)src + (uVar11 - 1);
          lVar8 = (long)src + (uVar11 - 10);
          do {
            lVar9 = 8;
            do {
              uVar18 = CTable[(ulong)*(byte *)(lVar2 + -8 + lVar9) + 1];
              if (0xc < (uVar18 & 0xff)) goto LAB_007c418a;
              uVar12 = uVar12 + uVar18;
              if (0x40 < ((uint)uVar12 & 0xff)) goto LAB_007c416b;
              uVar17 = uVar17 >> ((byte)uVar18 & 0x3f) | uVar18;
              lVar9 = lVar9 + -1;
            } while (lVar9 != 0);
            uVar18 = CTable[(ulong)*(byte *)((uVar11 - 9) + (long)src) + 1];
            if (0xc < (uVar18 & 0xff)) goto LAB_007c418a;
            uVar12 = uVar12 + uVar18;
            uVar13 = uVar12 & 0xff;
            if (0x40 < uVar13) goto LAB_007c416b;
            uVar18 = uVar17 >> ((byte)uVar18 & 0x3f) | uVar18;
            if (uVar13 == 0) goto LAB_007c41a9;
            if (puVar20 < puVar5) goto LAB_007c41c8;
            *puVar5 = uVar18 >> (-(char)uVar12 & 0x3fU);
            puVar5 = (ulong *)((uVar13 >> 3) + (long)puVar5);
            if (puVar20 < puVar5) goto LAB_007c41e7;
            lVar19 = 8;
            lVar9 = 0;
            uVar17 = 0;
            do {
              uVar13 = CTable[(ulong)*(byte *)(lVar8 + -8 + lVar19) + 1];
              if (0xc < (uVar13 & 0xff)) goto LAB_007c418a;
              lVar9 = lVar9 + uVar13;
              if (0x40 < ((uint)lVar9 & 0xff)) goto LAB_007c416b;
              uVar17 = uVar17 >> ((byte)uVar13 & 0x3f) | uVar13;
              lVar19 = lVar19 + -1;
            } while (lVar19 != 0);
            uVar13 = CTable[(ulong)*(byte *)((long)src + (uVar11 - 0x12)) + 1];
            if (0xc < (uVar13 & 0xff)) goto LAB_007c418a;
            uVar14 = lVar9 + uVar13;
            if (0x40 < (uVar14 & 0xff)) goto LAB_007c416b;
            if ((int)(uVar14 & 0xff) == 0x40) goto LAB_007c4225;
            uVar16 = uVar14 + ((uint)uVar12 & 7);
            uVar12 = uVar16 & 0xff;
            if (0x40 < uVar12) goto LAB_007c4206;
            if (uVar12 == 0) goto LAB_007c41a9;
            uVar17 = uVar17 >> ((byte)uVar13 & 0x3f) | uVar18 >> ((byte)uVar14 & 0x3f) | uVar13;
            *puVar5 = uVar17 >> (-(char)uVar16 & 0x3fU);
            puVar5 = (ulong *)((uVar12 >> 3) + (long)puVar5);
            if (puVar20 < puVar5) goto LAB_007c41e7;
            uVar12 = (ulong)((uint)uVar16 & 7);
            srcSize = uVar11 - 0x12;
            lVar2 = lVar2 + -0x12;
            lVar8 = lVar8 + -0x12;
            bVar1 = 0x12 < (long)uVar11;
            uVar11 = srcSize;
          } while (bVar1);
        }
      }
    }
    else {
      uVar3 = uVar4 + 3;
      if (-1 < (int)uVar4) {
        uVar3 = uVar4;
      }
      iVar6 = uVar4 - (uVar3 & 0xfffffffc);
      if (iVar6 < 1) {
        uVar12 = 0;
        uVar17 = 0;
      }
      else {
        pbVar7 = (byte *)((long)(int)uVar4 + (long)src);
        iVar6 = iVar6 + 1;
        uVar17 = 0;
        uVar11 = 0;
        do {
          pbVar7 = pbVar7 + -1;
          uVar12 = CTable[(ulong)*pbVar7 + 1];
          if (0xc < (uVar12 & 0xff)) goto LAB_007c418a;
          uVar11 = uVar11 + uVar12;
          uVar18 = uVar11 & 0xff;
          if (0x40 < uVar18) goto LAB_007c416b;
          uVar17 = uVar12 & 0xffffffffffffff00 | uVar17 >> ((byte)uVar12 & 0x3f);
          srcSize = (size_t)((int)srcSize - 1);
          iVar6 = iVar6 + -1;
        } while (1 < iVar6);
        if (uVar18 == 0) goto LAB_007c41a9;
        if (puVar20 < dst) goto LAB_007c41c8;
        uVar12 = (ulong)((uint)uVar11 & 7);
        *(ulong *)dst = uVar17 >> (-(char)uVar11 & 0x3fU);
        puVar5 = (ulong *)((uVar18 >> 3) + (long)dst);
        if (puVar20 < puVar5) {
          puVar5 = puVar20;
        }
      }
      if ((srcSize & 3) != 0) goto LAB_007c4244;
      if ((srcSize & 4) != 0) {
        lVar2 = (long)(int)srcSize;
        lVar8 = 3;
        do {
          uVar11 = CTable[(ulong)*(byte *)((long)src + lVar8 + lVar2 + -4) + 1];
          if (0xc < (uVar11 & 0xff)) goto LAB_007c418a;
          uVar12 = uVar12 + uVar11;
          if (0x40 < ((uint)uVar12 & 0xff)) goto LAB_007c416b;
          uVar17 = uVar17 >> ((byte)uVar11 & 0x3f) | uVar11;
          lVar8 = lVar8 + -1;
        } while (lVar8 != 0);
        uVar11 = CTable[(ulong)*(byte *)((long)src + lVar2 + -4) + 1];
        if (0xc < (uVar11 & 0xff)) goto LAB_007c418a;
        uVar13 = uVar12 + uVar11;
        uVar18 = uVar13 & 0xff;
        if (0x40 < uVar18) goto LAB_007c416b;
        uVar17 = uVar17 >> ((byte)uVar11 & 0x3f) | uVar11 & 0xffffffffffffff00;
        if (uVar18 == 0) goto LAB_007c41a9;
        if (puVar20 < puVar5) goto LAB_007c41c8;
        srcSize = lVar2 - 4;
        uVar12 = (ulong)((uint)uVar13 & 7);
        *puVar5 = uVar17 >> (-(char)uVar13 & 0x3fU);
        puVar5 = (ulong *)((uVar18 >> 3) + (long)puVar5);
        if (puVar20 < puVar5) {
          puVar5 = puVar20;
        }
      }
      if ((srcSize & 7) != 0) {
LAB_007c4263:
        __assert_fail("n % (2 * kUnroll) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                      ,0x3d8,
                      "void HUF_compress1X_usingCTable_internal_body_loop(HUF_CStream_t *, const BYTE *, size_t, const HUF_CElt *, int, int, int)"
                     );
      }
      if (0 < (int)srcSize) {
        uVar11 = srcSize & 0xffffffff;
        lVar2 = (long)src + (uVar11 - 1);
        lVar8 = (long)src + (uVar11 - 5);
        do {
          lVar9 = 3;
          do {
            uVar18 = CTable[(ulong)*(byte *)(lVar2 + -3 + lVar9) + 1];
            if (0xc < (uVar18 & 0xff)) goto LAB_007c418a;
            uVar12 = uVar12 + uVar18;
            if (0x40 < ((uint)uVar12 & 0xff)) goto LAB_007c416b;
            uVar17 = uVar17 >> ((byte)uVar18 & 0x3f) | uVar18;
            lVar9 = lVar9 + -1;
          } while (lVar9 != 0);
          uVar18 = CTable[(ulong)*(byte *)((uVar11 - 4) + (long)src) + 1];
          if (0xc < (uVar18 & 0xff)) goto LAB_007c418a;
          uVar12 = uVar12 + uVar18;
          uVar13 = uVar12 & 0xff;
          if (0x40 < uVar13) goto LAB_007c416b;
          uVar17 = uVar17 >> ((byte)uVar18 & 0x3f) | uVar18 & 0xffffffffffffff00;
          if (uVar13 == 0) goto LAB_007c41a9;
          if (puVar20 < puVar5) goto LAB_007c41c8;
          puVar10 = (ulong *)((uVar13 >> 3) + (long)puVar5);
          if (puVar20 < puVar10) {
            puVar10 = puVar20;
          }
          *puVar5 = uVar17 >> (-(char)uVar12 & 0x3fU);
          lVar19 = 3;
          lVar9 = 0;
          uVar18 = 0;
          do {
            uVar13 = CTable[(ulong)*(byte *)(lVar8 + -3 + lVar19) + 1];
            if (0xc < (uVar13 & 0xff)) goto LAB_007c418a;
            lVar9 = lVar9 + uVar13;
            if (0x40 < ((uint)lVar9 & 0xff)) goto LAB_007c416b;
            uVar18 = uVar18 >> ((byte)uVar13 & 0x3f) | uVar13;
            lVar19 = lVar19 + -1;
          } while (lVar19 != 0);
          uVar13 = CTable[(ulong)*(byte *)((long)src + (uVar11 - 8)) + 1];
          if (0xc < (uVar13 & 0xff)) goto LAB_007c418a;
          uVar14 = lVar9 + uVar13;
          if (0x40 < (uVar14 & 0xff)) goto LAB_007c416b;
          if ((int)(uVar14 & 0xff) == 0x40) {
LAB_007c4225:
            __assert_fail("(bitC->bitPos[1] & 0xFF) < HUF_BITS_IN_CONTAINER",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                          ,0x37a,"void HUF_mergeIndex1(HUF_CStream_t *)");
          }
          uVar15 = uVar14 + ((uint)uVar12 & 7);
          uVar16 = uVar15 & 0xff;
          if (0x40 < uVar16) {
LAB_007c4206:
            __assert_fail("(bitC->bitPos[0] & 0xFF) <= HUF_BITS_IN_CONTAINER",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                          ,0x37e,"void HUF_mergeIndex1(HUF_CStream_t *)");
          }
          if (uVar16 == 0) goto LAB_007c41a9;
          uVar17 = uVar18 >> ((byte)uVar13 & 0x3f) | uVar13 & 0xffffffffffffff00 |
                   uVar17 >> ((byte)uVar14 & 0x3f);
          uVar12 = (ulong)((uint)uVar15 & 7);
          *puVar10 = uVar17 >> (-(char)uVar15 & 0x3fU);
          puVar5 = (ulong *)((uVar16 >> 3) + (long)puVar10);
          if (puVar20 < puVar5) {
            puVar5 = puVar20;
          }
          srcSize = uVar11 - 8;
          lVar2 = lVar2 + -8;
          lVar8 = lVar8 + -8;
          bVar1 = 8 < (long)uVar11;
          uVar11 = srcSize;
        } while (bVar1);
      }
    }
    if ((int)srcSize != 0) {
      __assert_fail("n == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                    ,0x3ef,
                    "void HUF_compress1X_usingCTable_internal_body_loop(HUF_CStream_t *, const BYTE *, size_t, const HUF_CElt *, int, int, int)"
                   );
    }
    if (puVar20 < puVar5) {
      __assert_fail("bitC.ptr <= bitC.endPtr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                    ,0x43a,
                    "size_t HUF_compress1X_usingCTable_internal_body(void *, size_t, const void *, size_t, const HUF_CElt *)"
                   );
    }
    local_38 = 1;
    HUF_setValue(&local_38,1);
    if (0xc < (local_38 & 0xff)) {
LAB_007c418a:
      __assert_fail("HUF_getNbBits(elt) <= HUF_TABLELOG_ABSOLUTEMAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                    ,0x34f,"void HUF_addBits(HUF_CStream_t *, HUF_CElt, int, int)");
    }
    uVar12 = uVar12 + local_38;
    uVar11 = uVar12 & 0xff;
    if (0x40 < uVar11) {
LAB_007c416b:
      __assert_fail("(bitC->bitPos[idx] & 0xFF) <= HUF_BITS_IN_CONTAINER",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                    ,0x35b,"void HUF_addBits(HUF_CStream_t *, HUF_CElt, int, int)");
    }
    if (uVar11 == 0) {
LAB_007c41a9:
      __assert_fail("nbBits > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                    ,0x391,"void HUF_flushBits(HUF_CStream_t *, int)");
    }
    *puVar5 = (local_38 & 0xffffffffffffff00 | uVar17 >> ((byte)local_38 & 0x3f)) >>
              (-(char)uVar12 & 0x3fU);
    puVar5 = (ulong *)((uVar11 >> 3) + (long)puVar5);
    if (puVar20 < puVar5) {
      puVar5 = puVar20;
    }
    if (puVar5 < puVar20) {
      return (long)puVar5 - ((long)dst + ((ulong)((uVar12 & 7) == 0) - 1));
    }
  }
  return 0;
}

Assistant:

FORCE_INLINE_TEMPLATE size_t
HUF_compress1X_usingCTable_internal_body(void* dst, size_t dstSize,
                                   const void* src, size_t srcSize,
                                   const HUF_CElt* CTable)
{
    U32 const tableLog = (U32)CTable[0];
    HUF_CElt const* ct = CTable + 1;
    const BYTE* ip = (const BYTE*) src;
    BYTE* const ostart = (BYTE*)dst;
    BYTE* const oend = ostart + dstSize;
    BYTE* op = ostart;
    HUF_CStream_t bitC;

    /* init */
    if (dstSize < 8) return 0;   /* not enough space to compress */
    { size_t const initErr = HUF_initCStream(&bitC, op, (size_t)(oend-op));
      if (HUF_isError(initErr)) return 0; }

    if (dstSize < HUF_tightCompressBound(srcSize, (size_t)tableLog) || tableLog > 11)
        HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ MEM_32bits() ? 2 : 4, /* kFast */ 0, /* kLastFast */ 0);
    else {
        if (MEM_32bits()) {
            switch (tableLog) {
            case 11:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 2, /* kFastFlush */ 1, /* kLastFast */ 0);
                break;
            case 10: ZSTD_FALLTHROUGH;
            case 9: ZSTD_FALLTHROUGH;
            case 8:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 2, /* kFastFlush */ 1, /* kLastFast */ 1);
                break;
            case 7: ZSTD_FALLTHROUGH;
            default:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 3, /* kFastFlush */ 1, /* kLastFast */ 1);
                break;
            }
        } else {
            switch (tableLog) {
            case 11:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 5, /* kFastFlush */ 1, /* kLastFast */ 0);
                break;
            case 10:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 5, /* kFastFlush */ 1, /* kLastFast */ 1);
                break;
            case 9:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 6, /* kFastFlush */ 1, /* kLastFast */ 0);
                break;
            case 8:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 7, /* kFastFlush */ 1, /* kLastFast */ 0);
                break;
            case 7:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 8, /* kFastFlush */ 1, /* kLastFast */ 0);
                break;
            case 6: ZSTD_FALLTHROUGH;
            default:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 9, /* kFastFlush */ 1, /* kLastFast */ 1);
                break;
            }
        }
    }
    assert(bitC.ptr <= bitC.endPtr);

    return HUF_closeCStream(&bitC);
}